

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int * __thiscall ON_MeshTopology::GetIntArray(ON_MeshTopology *this,int length)

{
  memchunk *pmVar1;
  memchunk *pmVar2;
  
  if (0 < length) {
    pmVar1 = (memchunk *)onmalloc((ulong)(uint)length * 4 + 8);
    if (pmVar1 == (memchunk *)0x0) {
      pmVar2 = (memchunk *)0x0;
    }
    else {
      pmVar1->next = this->m_memchunk;
      pmVar2 = pmVar1 + 1;
      this->m_memchunk = pmVar1;
    }
    return (int *)pmVar2;
  }
  return (int *)0x0;
}

Assistant:

int* ON_MeshTopology::GetIntArray(int length)
{
  int* a = 0;
  if ( length > 0 ) {
    struct memchunk* pm;
    pm = (struct memchunk*)onmalloc(length*sizeof(*a) + sizeof(*pm));
    if ( pm ) {
      pm->next = m_memchunk;
      m_memchunk = pm++;
      a = (int*)pm;
    }
  }
  return a;
}